

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  uint uVar1;
  bool bVar2;
  undefined8 *in_RDX;
  CheckedError *ce;
  uint16_t fixed_length;
  allocator<char> local_79;
  string local_78 [32];
  ParseDepthGuard depth_guard;
  uint local_48 [2];
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined6 uStack_36;
  undefined2 uStack_30;
  
  if (*(int *)&type->field_0x1c == 0x5b) {
    ParseDepthGuard::ParseDepthGuard(&depth_guard,(Parser *)type);
    ParseDepthGuard::Check((ParseDepthGuard *)this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        uStack_38 = 0;
        uStack_36 = 0;
        uStack_30 = 0;
        local_48[0] = 0;
        local_48[1] = 0;
        uStack_40 = 0;
        uStack_3e = 0;
        ParseType(this,type);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001062dd;
        CheckedError::~CheckedError((CheckedError *)this);
        uVar1 = local_48[0];
        if ((local_48[0] < 0x13) && ((0x64000U >> (local_48[0] & 0x1f) & 1) != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_78,"nested vector types not supported (wrap in table first)",
                     (allocator<char> *)&fixed_length);
          Error(this,(string *)type);
          goto LAB_001062d3;
        }
        if (*(int *)&type->field_0x1c == 0x3a) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            if (*(int *)&type->field_0x1c == 0x102) {
              fixed_length = 0;
              bVar2 = StringToNumber<unsigned_short>((char *)type[1].struct_def,&fixed_length);
              if (bVar2 && fixed_length != 0) {
                *in_RDX = 0x11;
                in_RDX[1] = CONCAT62(uStack_3e,uStack_40);
                in_RDX[2] = CONCAT62(uStack_36,uStack_38);
                *(uint16_t *)(in_RDX + 3) = fixed_length;
                Next(this);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckedError::~CheckedError((CheckedError *)this);
                  goto LAB_0010648b;
                }
                goto LAB_001062dd;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        (local_78,
                         "length of fixed-length array must be positive and fit to uint16_t type",
                         &local_79);
              Error(this,(string *)type);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_78,"length of fixed-length array must be an integer value",
                         (allocator<char> *)&fixed_length);
              Error(this,(string *)type);
            }
LAB_001062d3:
            std::__cxx11::string::~string(local_78);
          }
          goto LAB_001062dd;
        }
        *in_RDX = 0xe;
        in_RDX[1] = CONCAT62(uStack_3e,uStack_40);
        in_RDX[2] = CONCAT62(uStack_36,uStack_38);
        *(undefined2 *)(in_RDX + 3) = 0;
LAB_0010648b:
        *(uint *)((long)in_RDX + 4) = uVar1;
        Expect(this,(int)type);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001062dd;
        CheckedError::~CheckedError((CheckedError *)this);
        (depth_guard.parser_)->parse_depth_counter_ =
             (depth_guard.parser_)->parse_depth_counter_ + -1;
        goto LAB_00106365;
      }
    }
LAB_001062dd:
    (depth_guard.parser_)->parse_depth_counter_ = (depth_guard.parser_)->parse_depth_counter_ + -1;
  }
  else {
    if (*(int *)&type->field_0x1c != 0x104) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_48,"illegal type syntax",(allocator<char> *)local_78);
      Error(this,(string *)type);
      std::__cxx11::string::~string((string *)local_48);
      goto LAB_00106369;
    }
    bVar2 = IsIdent((Parser *)type,"bool");
    if (bVar2) {
      *(undefined4 *)in_RDX = 2;
LAB_00106349:
      Next(this);
    }
    else {
      bVar2 = IsIdent((Parser *)type,"byte");
      if (bVar2) {
LAB_00106342:
        *(undefined4 *)in_RDX = 3;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"int8");
      if (bVar2) goto LAB_00106342;
      bVar2 = IsIdent((Parser *)type,"ubyte");
      if (bVar2) {
LAB_0010639f:
        *(undefined4 *)in_RDX = 4;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"uint8");
      if (bVar2) goto LAB_0010639f;
      bVar2 = IsIdent((Parser *)type,"short");
      if (bVar2) {
LAB_001063d2:
        *(undefined4 *)in_RDX = 5;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"int16");
      if (bVar2) goto LAB_001063d2;
      bVar2 = IsIdent((Parser *)type,"ushort");
      if (bVar2) {
LAB_001064e8:
        *(undefined4 *)in_RDX = 6;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"uint16");
      if (bVar2) goto LAB_001064e8;
      bVar2 = IsIdent((Parser *)type,"int");
      if (bVar2) {
LAB_00106545:
        *(undefined4 *)in_RDX = 7;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"int32");
      if (bVar2) goto LAB_00106545;
      bVar2 = IsIdent((Parser *)type,"uint");
      if (bVar2) {
LAB_001065a2:
        *(undefined4 *)in_RDX = 8;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"uint32");
      if (bVar2) goto LAB_001065a2;
      bVar2 = IsIdent((Parser *)type,"long");
      if (bVar2) {
LAB_001065d4:
        *(undefined4 *)in_RDX = 9;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"int64");
      if (bVar2) goto LAB_001065d4;
      bVar2 = IsIdent((Parser *)type,"ulong");
      if (bVar2) {
LAB_00106606:
        *(undefined4 *)in_RDX = 10;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"uint64");
      if (bVar2) goto LAB_00106606;
      bVar2 = IsIdent((Parser *)type,"float");
      if (bVar2) {
LAB_00106638:
        *(undefined4 *)in_RDX = 0xb;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"float32");
      if (bVar2) goto LAB_00106638;
      bVar2 = IsIdent((Parser *)type,"double");
      if (bVar2) {
LAB_0010666a:
        *(undefined4 *)in_RDX = 0xc;
        goto LAB_00106349;
      }
      bVar2 = IsIdent((Parser *)type,"float64");
      if (bVar2) goto LAB_0010666a;
      bVar2 = IsIdent((Parser *)type,"string");
      if (bVar2) {
        *(undefined4 *)in_RDX = 0xd;
        goto LAB_00106349;
      }
      ParseTypeIdent(this,type);
    }
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00106369;
    CheckedError::~CheckedError((CheckedError *)this);
LAB_00106365:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_00106369:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseType(Type &type) {
  if (token_ == kTokenIdentifier) {
    if (IsIdent("bool")) {
      type.base_type = BASE_TYPE_BOOL;
      NEXT();
    } else if (IsIdent("byte") || IsIdent("int8")) {
      type.base_type = BASE_TYPE_CHAR;
      NEXT();
    } else if (IsIdent("ubyte") || IsIdent("uint8")) {
      type.base_type = BASE_TYPE_UCHAR;
      NEXT();
    } else if (IsIdent("short") || IsIdent("int16")) {
      type.base_type = BASE_TYPE_SHORT;
      NEXT();
    } else if (IsIdent("ushort") || IsIdent("uint16")) {
      type.base_type = BASE_TYPE_USHORT;
      NEXT();
    } else if (IsIdent("int") || IsIdent("int32")) {
      type.base_type = BASE_TYPE_INT;
      NEXT();
    } else if (IsIdent("uint") || IsIdent("uint32")) {
      type.base_type = BASE_TYPE_UINT;
      NEXT();
    } else if (IsIdent("long") || IsIdent("int64")) {
      type.base_type = BASE_TYPE_LONG;
      NEXT();
    } else if (IsIdent("ulong") || IsIdent("uint64")) {
      type.base_type = BASE_TYPE_ULONG;
      NEXT();
    } else if (IsIdent("float") || IsIdent("float32")) {
      type.base_type = BASE_TYPE_FLOAT;
      NEXT();
    } else if (IsIdent("double") || IsIdent("float64")) {
      type.base_type = BASE_TYPE_DOUBLE;
      NEXT();
    } else if (IsIdent("string")) {
      type.base_type = BASE_TYPE_STRING;
      NEXT();
    } else {
      ECHECK(ParseTypeIdent(type));
    }
  } else if (token_ == '[') {
    ParseDepthGuard depth_guard(this);
    ECHECK(depth_guard.Check());
    NEXT();
    Type subtype;
    ECHECK(ParseType(subtype));
    if (IsSeries(subtype)) {
      // We could support this, but it will complicate things, and it's
      // easier to work around with a struct around the inner vector.
      return Error("nested vector types not supported (wrap in table first)");
    }
    if (token_ == ':') {
      NEXT();
      if (token_ != kTokenIntegerConstant) {
        return Error("length of fixed-length array must be an integer value");
      }
      uint16_t fixed_length = 0;
      bool check = StringToNumber(attribute_.c_str(), &fixed_length);
      if (!check || fixed_length < 1) {
        return Error(
            "length of fixed-length array must be positive and fit to "
            "uint16_t type");
      }
      type = Type(BASE_TYPE_ARRAY, subtype.struct_def, subtype.enum_def,
                  fixed_length);
      NEXT();
    } else {
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def, subtype.enum_def);
    }
    type.element = subtype.base_type;
    EXPECT(']');
  } else {
    return Error("illegal type syntax");
  }
  return NoError();
}